

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O2

bool amrex::StateDescriptor::bf_thread_safety
               (int *param_1,int *param_2,int *param_3,int *param_4,int *bc,int ng)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  
  bVar3 = true;
  if (bf_ext_dir_threadsafe == 0) {
    lVar2 = 0;
    bVar3 = false;
    while ((lVar2 < ng * 6 && (!bVar3))) {
      piVar1 = bc + lVar2;
      lVar2 = lVar2 + 1;
      bVar3 = *piVar1 == 3;
    }
    bVar3 = (bool)(bVar3 ^ 1);
  }
  return bVar3;
}

Assistant:

bool
StateDescriptor::bf_thread_safety (const int* /*lo*/,const int* /*hi*/,
                                   const int* /*dom_lo*/, const int* /*dom_hi*/,
                                   const int* bc, int ng)
{
    bool thread_safe = true;
    if (!bf_ext_dir_threadsafe) {
        bool has_ext_dir = false;
        for (int i=0; i<2*AMREX_SPACEDIM*ng && !has_ext_dir; ++i) {
            has_ext_dir = bc[i]==BCType::ext_dir;
        }
        if (has_ext_dir) thread_safe = false;
    }
    return thread_safe;
}